

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O3

Geometry * __thiscall
lf::refinement::MeshHierarchy::GeometryInParent(MeshHierarchy *this,size_type level,Entity *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
  _Var3;
  uint uVar4;
  dim_t codim;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *pvVar5;
  runtime_error *this_00;
  stringstream ss;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [392];
  
  if (level == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"level must be that of a child mesh!",0x23);
    paVar1 = &local_1f0.field_2;
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"level > 0","");
    paVar2 = &local_210.field_2;
    local_210._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1f0,&local_210,0x746,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
    local_210._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,"");
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    base::AssertionFailed(&local_1f0,&local_210,0x746,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    abort();
  }
  getMesh((MeshHierarchy *)local_1b0,(size_type)this);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
  }
  uVar4 = (**(code **)(*(_func_int **)local_1b0._0_8_ + 0x28))(local_1b0._0_8_,e);
  codim = (**e->_vptr_Entity)(e);
  pvVar5 = ParentInfos(this,level,codim);
  _Var3._M_t.
  super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
  .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl =
       (pvVar5->
       super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>).
       _M_impl.super__Vector_impl_data._M_start[uVar4].rel_ref_geo_._M_t.
       super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
       ._M_t;
  if ((_Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
        .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl !=
      (Geometry *)0x0) {
    return (Geometry *)
           (_Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
            )_Var3._M_t.
             super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
             .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x10),"No valid parent information for ",0x20);
  mesh::operator<<((ostream *)(local_1b0 + 0x10),e);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"e_parent_info.rel_ref_geo_ != nullptr","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1f0,&local_210,0x752,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const lf::geometry::Geometry *MeshHierarchy::GeometryInParent(
    size_type level, const lf::mesh::Entity &e) const {
  LF_ASSERT_MSG(level > 0, "level must be that of a child mesh!");
  // Obtain reference to fine mesh
  const lf::mesh::Mesh &mesh{*getMesh(level)};
  // Get index of entity in fine mesh
  const lf::base::glb_idx_t idx_e{mesh.Index(e)};
  // Access information on parent
  const std::vector<ParentInfo> &parent_infos{ParentInfos(level, e.Codim())};
  // Fetch ParentInfo structure for entity e
  const ParentInfo &e_parent_info{parent_infos[idx_e]};
  // Just return the information contained in the relevant ParentInfo
  // structure
  LF_VERIFY_MSG(e_parent_info.rel_ref_geo_ != nullptr,
                "No valid parent information for " << e);
  return e_parent_info.rel_ref_geo_.get();
}